

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

int Wlc_NtkDupOneObject(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int TypeNew,Vec_Int_t *vFanins)

{
  ushort uVar1;
  Vec_Int_t *p_00;
  int iObj_00;
  uint uVar2;
  int i;
  int iVar3;
  int iVar4;
  int iObjCopy;
  int nFanins;
  int iObjNew;
  uint Type;
  int iObj;
  Vec_Int_t *vFanins_local;
  int TypeNew_local;
  Wlc_Obj_t *pObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  iObj_00 = Wlc_ObjId(p,pObj);
  uVar1 = *(ushort *)pObj;
  uVar2 = Wlc_ObjFaninNum(pObj);
  i = Wlc_ObjCopy(p,iObj_00);
  *(ushort *)pObj = *(ushort *)pObj & 0xffc0 | (ushort)TypeNew & 0x3f;
  pObj->nFanins = 0;
  iVar3 = Wlc_ObjDup(pNew,p,iObj_00,vFanins);
  *(ushort *)pObj = *(ushort *)pObj & 0xffc0 | uVar1 & 0x3f;
  pObj->nFanins = uVar2;
  if (TypeNew == 3) {
    p_00 = pNew->vInits;
    iVar4 = Wlc_ObjRange(pObj);
    Vec_IntPush(p_00,-iVar4);
    Wlc_ObjSetCopy(p,iObj_00,i);
  }
  return iVar3;
}

Assistant:

int Wlc_NtkDupOneObject( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int TypeNew, Vec_Int_t * vFanins )
{
    int iObj = Wlc_ObjId(p, pObj);
    unsigned Type = pObj->Type;
    int iObjNew, nFanins = Wlc_ObjFaninNum(pObj);
    int iObjCopy = Wlc_ObjCopy(p, iObj);
    pObj->Type = TypeNew;
    pObj->nFanins = 0;
    iObjNew = Wlc_ObjDup( pNew, p, iObj, vFanins );
    pObj->Type = Type;
    pObj->nFanins = (unsigned)nFanins;
    if ( TypeNew == WLC_OBJ_FO )
    {
        Vec_IntPush( pNew->vInits, -Wlc_ObjRange(pObj) );
        Wlc_ObjSetCopy( p, iObj, iObjCopy );
    }
    return iObjNew;
}